

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O2

aiMaterial * __thiscall
Assimp::MMDImporter::CreateMaterial(MMDImporter *this,PmxMaterial *pMat,PmxModel *pModel)

{
  ulong uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  aiMaterial *this_00;
  long lVar3;
  size_t sVar4;
  float shininess;
  float opacity;
  aiColor3D local_868;
  aiColor3D local_858;
  aiColor3D local_848;
  int mapping_uvwsrc;
  undefined1 local_834 [1024];
  aiString name;
  
  this_00 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(this_00);
  uVar1 = (pMat->material_english_name)._M_string_length;
  sVar4 = uVar1 & 0xffffffff;
  if ((uVar1 & 0xfffffc00) != 0) {
    sVar4 = 0x3ff;
  }
  name.length = (ai_uint32)sVar4;
  memcpy(name.data,(pMat->material_english_name)._M_dataplus._M_p,sVar4);
  name.data[sVar4] = '\0';
  aiMaterial::AddProperty(this_00,&name,"?mat.name",0,0);
  local_848.b = pMat->diffuse[2];
  local_848.r = pMat->diffuse[0];
  local_848.g = pMat->diffuse[1];
  aiMaterial::AddProperty(this_00,&local_848,1,"$clr.diffuse",0,0);
  local_858.b = pMat->specular[2];
  local_858.r = pMat->specular[0];
  local_858.g = pMat->specular[1];
  aiMaterial::AddProperty(this_00,&local_858,1,"$clr.specular",0,0);
  local_868.b = pMat->ambient[2];
  local_868.r = pMat->ambient[0];
  local_868.g = pMat->ambient[1];
  aiMaterial::AddProperty(this_00,&local_868,1,"$clr.ambient",0,0);
  opacity = pMat->diffuse[3];
  aiMaterial::AddProperty(this_00,&opacity,1,"$mat.opacity",0,0);
  shininess = pMat->specularlity;
  aiMaterial::AddProperty(this_00,&shininess,1,"$mat.shinpercent",0,0);
  lVar3 = (long)pMat->diffuse_texture_index;
  if (-1 < lVar3) {
    pbVar2 = (pModel->textures)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    uVar1 = pbVar2[lVar3]._M_string_length;
    sVar4 = 0x3ff;
    if ((uVar1 & 0xfffffc00) == 0) {
      sVar4 = uVar1 & 0xffffffff;
    }
    mapping_uvwsrc = (int)sVar4;
    memcpy(local_834,pbVar2[lVar3]._M_dataplus._M_p,sVar4);
    local_834[sVar4] = 0;
    aiMaterial::AddProperty(this_00,(aiString *)&mapping_uvwsrc,"$tex.file",1,0);
  }
  mapping_uvwsrc = 0;
  aiMaterial::AddProperty(this_00,&mapping_uvwsrc,1,"$tex.uvwsrc",1,0);
  return this_00;
}

Assistant:

aiMaterial *MMDImporter::CreateMaterial(const pmx::PmxMaterial *pMat,
                                        const pmx::PmxModel *pModel) {
  aiMaterial *mat = new aiMaterial();
  aiString name(pMat->material_english_name);
  mat->AddProperty(&name, AI_MATKEY_NAME);

  aiColor3D diffuse(pMat->diffuse[0], pMat->diffuse[1], pMat->diffuse[2]);
  mat->AddProperty(&diffuse, 1, AI_MATKEY_COLOR_DIFFUSE);
  aiColor3D specular(pMat->specular[0], pMat->specular[1], pMat->specular[2]);
  mat->AddProperty(&specular, 1, AI_MATKEY_COLOR_SPECULAR);
  aiColor3D ambient(pMat->ambient[0], pMat->ambient[1], pMat->ambient[2]);
  mat->AddProperty(&ambient, 1, AI_MATKEY_COLOR_AMBIENT);

  float opacity = pMat->diffuse[3];
  mat->AddProperty(&opacity, 1, AI_MATKEY_OPACITY);
  float shininess = pMat->specularlity;
  mat->AddProperty(&shininess, 1, AI_MATKEY_SHININESS_STRENGTH);

  if(pMat->diffuse_texture_index >= 0) {
      aiString texture_path(pModel->textures[pMat->diffuse_texture_index]);
      mat->AddProperty(&texture_path, AI_MATKEY_TEXTURE(aiTextureType_DIFFUSE, 0));
  }

  int mapping_uvwsrc = 0;
  mat->AddProperty(&mapping_uvwsrc, 1,
                   AI_MATKEY_UVWSRC(aiTextureType_DIFFUSE, 0));

  return mat;
}